

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void enumerate_bbs(gen_ctx_t gen_ctx)

{
  bb_t_conflict bb_00;
  bb_t_conflict local_28;
  bb_t_conflict bb;
  size_t rpost;
  size_t pre;
  gen_ctx_t gen_ctx_local;
  
  pre = (size_t)gen_ctx;
  for (local_28 = DLIST_bb_t_head(&gen_ctx->curr_cfg->bbs); local_28 != (bb_t_conflict)0x0;
      local_28 = DLIST_bb_t_next(local_28)) {
    local_28->rpost = 0;
    local_28->pre = 0;
  }
  rpost = 1;
  bb = (bb_t_conflict)DLIST_bb_t_length((DLIST_bb_t *)(*(long *)(pre + 0x108) + 0x18));
  bb_00 = DLIST_bb_t_head((DLIST_bb_t *)(*(long *)(pre + 0x108) + 0x18));
  DFS(bb_00,&rpost,(size_t *)&bb);
  return;
}

Assistant:

static void enumerate_bbs (gen_ctx_t gen_ctx) {
  size_t pre, rpost;

  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    bb->pre = bb->rpost = 0;
  pre = 1;
  rpost = DLIST_LENGTH (bb_t, curr_cfg->bbs);
  DFS (DLIST_HEAD (bb_t, curr_cfg->bbs), &pre, &rpost);
}